

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_yin.c
# Opt level: O0

LY_ERR yin_parse_refine(lysp_yin_ctx *ctx,lysp_refine **refines)

{
  lysp_refine *arg_val;
  size_t sVar1;
  ly_ctx *local_158;
  LY_ERR ret___3;
  LY_ERR ret___2;
  yin_subelement subelems [11];
  LY_ERR ret___1;
  LY_ERR ret__;
  char *p__;
  lysp_refine *rf;
  lysp_refine **refines_local;
  lysp_yin_ctx *ctx_local;
  
  if (*refines == (lysp_refine *)0x0) {
    _ret___1 = (undefined8 *)malloc(0x58);
    if (_ret___1 == (undefined8 *)0x0) {
      ly_log(ctx->xmlctx->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","yin_parse_refine"
            );
      return LY_EMEM;
    }
    *_ret___1 = 1;
  }
  else {
    *(long *)&(*refines)[-1].flags = *(long *)&(*refines)[-1].flags + 1;
    _ret___1 = (undefined8 *)
               realloc(&(*refines)[-1].flags,*(long *)&(*refines)[-1].flags * 0x50 + 8);
    if (_ret___1 == (undefined8 *)0x0) {
      *(long *)&(*refines)[-1].flags = *(long *)&(*refines)[-1].flags + -1;
      ly_log(ctx->xmlctx->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","yin_parse_refine"
            );
      return LY_EMEM;
    }
  }
  *refines = (lysp_refine *)(_ret___1 + 1);
  arg_val = *refines + *(long *)&(*refines)[-1].flags + -1;
  memset(arg_val,0,0x50);
  ctx_local._4_4_ = lyxml_ctx_next(ctx->xmlctx);
  if ((ctx_local._4_4_ == LY_SUCCESS) &&
     (ctx_local._4_4_ =
           yin_parse_attribute(ctx,YIN_ARG_TARGET_NODE,&arg_val->nodeid,Y_STR_ARG,LY_STMT_REFINE),
     ctx_local._4_4_ == LY_SUCCESS)) {
    sVar1 = strlen(arg_val->nodeid);
    if (sVar1 == 0) {
      if (ctx == (lysp_yin_ctx *)0x0) {
        local_158 = (ly_ctx *)0x0;
      }
      else {
        local_158 = (ly_ctx *)
                    **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1]
        ;
      }
      ly_log(local_158,LY_LLWRN,LY_SUCCESS,"Empty argument of %s statement does not make sense.",
             "refine");
    }
    ret___3 = 0x50000;
    subelems[0]._0_8_ = &arg_val->flags;
    subelems[0].dest._0_2_ = 2;
    subelems[0].flags = 0;
    subelems[0]._18_2_ = 7;
    subelems[1]._0_8_ = &arg_val->dflts;
    subelems[1].dest._0_2_ = 0;
    subelems[1].flags = 0;
    subelems[1]._18_2_ = 8;
    subelems[2]._0_8_ = &arg_val->dsc;
    subelems[2].dest._0_2_ = 2;
    subelems[2].flags = 0;
    subelems[2]._18_2_ = 0x13;
    subelems[3]._0_8_ = &arg_val->iffeatures;
    subelems[3].dest._0_2_ = 0;
    subelems[3].flags = 0;
    subelems[3]._18_2_ = 0x18;
    subelems[4]._0_8_ = &arg_val->flags;
    subelems[4].dest._0_2_ = 2;
    subelems[4].flags = 0;
    subelems[4]._18_2_ = 0x19;
    subelems[5].dest._0_2_ = 2;
    subelems[5].flags = 0;
    subelems[5]._18_2_ = 0x1a;
    subelems[6].dest._0_2_ = 2;
    subelems[6].flags = 0;
    subelems[6]._18_2_ = 0x1d;
    subelems[7]._0_8_ = &arg_val->musts;
    subelems[7].dest._0_2_ = 0;
    subelems[7].flags = 0;
    subelems[7]._18_2_ = 0x25;
    subelems[8]._0_8_ = &arg_val->presence;
    subelems[8].dest._0_2_ = 2;
    subelems[8].flags = 0;
    subelems[8]._18_2_ = 0x27;
    subelems[9]._0_8_ = &arg_val->ref;
    subelems[9].dest._0_2_ = 2;
    subelems[5]._0_8_ = arg_val;
    subelems[6]._0_8_ = arg_val;
    memset(&subelems[9].flags,0,0x18);
    subelems[9].flags = 0;
    subelems[9]._18_2_ = 0xf;
    ctx_local._4_4_ =
         yin_parse_content(ctx,(yin_subelement *)&ret___3,0xb,arg_val,LY_STMT_REFINE,(char **)0x0,
                           &arg_val->exts);
    if ((ctx_local._4_4_ == LY_SUCCESS) &&
       (ctx_local._4_4_ = yin_unres_exts_add(ctx,arg_val->exts), ctx_local._4_4_ == LY_SUCCESS)) {
      ctx_local._4_4_ = LY_SUCCESS;
    }
  }
  return ctx_local._4_4_;
}

Assistant:

static LY_ERR
yin_parse_refine(struct lysp_yin_ctx *ctx, struct lysp_refine **refines)
{
    struct lysp_refine *rf;

    /* allocate new refine */
    LY_ARRAY_NEW_RET(ctx->xmlctx->ctx, *refines, rf, LY_EMEM);

    /* parse attribute */
    LY_CHECK_RET(lyxml_ctx_next(ctx->xmlctx));
    LY_CHECK_RET(yin_parse_attribute(ctx, YIN_ARG_TARGET_NODE, &rf->nodeid, Y_STR_ARG, LY_STMT_REFINE));
    CHECK_NONEMPTY(ctx, strlen(rf->nodeid), "refine");

    /* parse content */
    struct yin_subelement subelems[] = {
        {LY_STMT_CONFIG, &rf->flags, YIN_SUBELEM_UNIQUE},
        {LY_STMT_DEFAULT, &rf->dflts, 0},
        {LY_STMT_DESCRIPTION, &rf->dsc, YIN_SUBELEM_UNIQUE},
        {LY_STMT_IF_FEATURE, &rf->iffeatures, 0},
        {LY_STMT_MANDATORY, &rf->flags, YIN_SUBELEM_UNIQUE},
        {LY_STMT_MAX_ELEMENTS, rf, YIN_SUBELEM_UNIQUE},
        {LY_STMT_MIN_ELEMENTS, rf, YIN_SUBELEM_UNIQUE},
        {LY_STMT_MUST, &rf->musts, 0},
        {LY_STMT_PRESENCE, &rf->presence, YIN_SUBELEM_UNIQUE},
        {LY_STMT_REFERENCE, &rf->ref, YIN_SUBELEM_UNIQUE},
        {LY_STMT_EXTENSION_INSTANCE, NULL, 0},
    };

    LY_CHECK_RET(yin_parse_content(ctx, subelems, ly_sizeofarray(subelems), rf, LY_STMT_REFINE, NULL, &rf->exts));

    /* store extension instance array (no realloc anymore) to find the plugin records and finish parsing */
    LY_CHECK_RET(yin_unres_exts_add(ctx, rf->exts));

    return LY_SUCCESS;
}